

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O2

DistributionMapping __thiscall
amrex::DistributionMapping::makeSFC
          (DistributionMapping *this,LayoutData<double> *rcost_local,Real *currentEfficiency,
          Real *proposedEfficiency,bool broadcastToAll,int root)

{
  double dVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar3;
  ulong uVar4;
  DistributionMapping DVar5;
  allocator_type local_61;
  Vector<double,_std::allocator<double>_> rcost;
  Vector<long,_std::allocator<long>_> cost;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&rcost.super_vector<double,_std::allocator<double>_>,
             (long)(int)(((*(long **)(rcost_local + 0x50))[1] - **(long **)(rcost_local + 0x50)) /
                        0x1c),(allocator_type *)&cost);
  ParallelDescriptor::GatherLayoutDataToVector<double>
            (rcost_local,
             (Vector<double,_std::allocator<double>_> *)
             &rcost.super_vector<double,_std::allocator<double>_>,root);
  std::make_shared<amrex::DistributionMapping::Ref>();
  if (*(int *)(ParallelContext::frames + 0xc) == root) {
    std::vector<long,_std::allocator<long>_>::vector
              (&cost.super_vector<long,_std::allocator<long>_>,
               (long)rcost.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)rcost.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,&local_61);
    _Var2 = std::
            __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (rcost.super_vector<double,_std::allocator<double>_>.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
    dVar1 = *_Var2._M_current;
    uVar4 = -(ulong)(dVar1 == 0.0);
    for (lVar3 = 0;
        lVar3 < (long)rcost.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)rcost.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3; lVar3 = lVar3 + 1) {
      cost.super_vector<long,_std::allocator<long>_>.super__Vector_base<long,_std::allocator<long>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar3] =
           (long)(rcost.super_vector<double,_std::allocator<double>_>.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3] *
                 (double)(uVar4 & 0x41cdcd6500000000 | ~uVar4 & (ulong)(1000000000.0 / dVar1))) + 1;
    }
    SFCProcessorMap(this,(BoxArray *)(rcost_local + 8),
                    &cost.super_vector<long,_std::allocator<long>_>,
                    *(int *)(ParallelContext::frames + 0x10),proposedEfficiency,false);
    ComputeDistributionMappingEfficiency
              ((DistributionMapping *)(rcost_local + 0x70),&rcost,currentEfficiency);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              ((_Vector_base<long,_std::allocator<long>_> *)&cost);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&rcost);
  DVar5.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  DVar5.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (DistributionMapping)
         DVar5.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

DistributionMapping
DistributionMapping::makeSFC (const LayoutData<Real>& rcost_local,
                              Real& currentEfficiency, Real& proposedEfficiency,
                              bool broadcastToAll, int root)
{
    BL_PROFILE("makeSFC");

    // Proposed distribution mapping is computed from global vector of costs on root;
    // required information is gathered on root from the layoutData information
    //
    // Two main steps:
    // 1. collect from rcost_local into the global cost vector rcost; then rcost is
    //    complete (only) on root
    // 2. (optional; default true) Broadcast processor map of the new dm to others

    Vector<Real> rcost(rcost_local.size());
    ParallelDescriptor::GatherLayoutDataToVector<Real>(rcost_local, rcost, root);
    // rcost is now filled out on root;

    DistributionMapping r;
    if (ParallelDescriptor::MyProc() == root)
    {
        Vector<Long> cost(rcost.size());

        Real wmax = *std::max_element(rcost.begin(), rcost.end());
        Real scale = (wmax == 0) ? 1.e9_rt : 1.e9_rt/wmax;

        for (int i = 0; i < rcost.size(); ++i) {
            cost[i] = Long(rcost[i]*scale) + 1L;
        }

        // `sort` needs to be false here since there's a parallel reduce function
        // in the processor map function, but we are executing only on root
        int nprocs = ParallelDescriptor::NProcs();
        r.SFCProcessorMap(rcost_local.boxArray(), cost, nprocs, proposedEfficiency, false);

        ComputeDistributionMappingEfficiency(rcost_local.DistributionMap(),
                                             rcost,
                                             &currentEfficiency);
    }

#ifdef BL_USE_MPI
    // Load-balanced distribution mapping is computed on root; broadcast the cost
    // to all proc (optional)
    if (broadcastToAll)
    {
        Vector<int> pmap(rcost_local.DistributionMap().size());
        if (ParallelDescriptor::MyProc() == root)
        {
            pmap = r.ProcessorMap();
        }

        // Broadcast vector from which to construct new distribution mapping
        ParallelDescriptor::Bcast(&pmap[0], pmap.size(), root);
        if (ParallelDescriptor::MyProc() != root)
        {
            r = DistributionMapping(pmap);
        }
    }
#else
    amrex::ignore_unused(broadcastToAll);
#endif

    return r;
}